

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxquality.hpp
# Opt level: O3

void __thiscall
soplex::SPxSolverBase<double>::qualBoundViolation
          (SPxSolverBase<double> *this,double *maxviol,double *sumviol)

{
  double dVar1;
  double dVar2;
  pointer pdVar3;
  pointer pdVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  VectorBase<double> solu;
  VectorBase<double> local_38;
  
  *maxviol = 0.0;
  *sumviol = 0.0;
  VectorBase<double>::VectorBase
            (&local_38,
             (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
             thenum);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x60])(this);
  lVar5 = (long)(this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
                set.thenum;
  if (lVar5 < 1) {
    if (local_38.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      return;
    }
  }
  else {
    pdVar3 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar4 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    lVar6 = 0;
    do {
      dVar1 = local_38.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar6];
      dVar2 = pdVar3[lVar6];
      if (dVar2 <= dVar1) {
        dVar2 = pdVar4[lVar6];
        dVar7 = 0.0;
        if (dVar2 < dVar1) goto LAB_001be891;
      }
      else {
LAB_001be891:
        dVar7 = ABS(dVar1 - dVar2);
      }
      if (*maxviol <= dVar7 && dVar7 != *maxviol) {
        *maxviol = dVar7;
      }
      *sumviol = dVar7 + *sumviol;
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  operator_delete(local_38.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_38.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_38.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return;
}

Assistant:

void SPxSolverBase<R>::qualBoundViolation(
   R& maxviol, R& sumviol) const
{
   maxviol = 0.0;
   sumviol = 0.0;

   VectorBase<R> solu(this->nCols());

   getPrimalSol(solu);

   for(int col = 0; col < this->nCols(); ++col)
   {
      assert(this->lower(col) <= this->upper(col) + 1e-9);

      R viol = 0.0;

      if(solu[col] < this->lower(col))
         viol = spxAbs(solu[col] - this->lower(col));
      else if(solu[col] > this->upper(col))
         viol = spxAbs(solu[col] - this->upper(col));

      if(viol > maxviol)
         maxviol = viol;

      sumviol += viol;
   }
}